

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int KINSetPreconditioner(void *kinmem,KINLsPrecSetupFn psetup,KINLsPrecSolveFn psolve)

{
  int iVar1;
  int line;
  int error_code;
  char *msgfmt;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KINMem local_30;
  KINLsMem local_28;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINSetPreconditioner",&local_30,&local_28);
  if (iVar1 == 0) {
    local_28->pset = psetup;
    local_28->psolve = psolve;
    if (local_28->LS->ops->setpreconditioner ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
      msgfmt = "SUNLinearSolver object does not support user-supplied preconditioning";
      iVar1 = -3;
      error_code = -3;
      line = 0x123;
    }
    else {
      if (psetup != (KINLsPrecSetupFn)0x0) {
        psetup = kinLsPSetup;
      }
      if (psolve != (KINLsPrecSolveFn)0x0) {
        psolve = kinLsPSolve;
      }
      iVar1 = SUNLinSolSetPreconditioner(local_28->LS,local_30,psetup,psolve);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "Error in calling SUNLinSolSetPreconditioner";
      iVar1 = -8;
      error_code = -8;
      line = 0x130;
    }
    KINProcessError(local_30,error_code,line,"KINSetPreconditioner",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                    ,msgfmt);
  }
  return iVar1;
}

Assistant:

int KINSetPreconditioner(void* kinmem, KINLsPrecSetupFn psetup,
                         KINLsPrecSolveFn psolve)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  SUNPSetupFn kinls_psetup;
  SUNPSolveFn kinls_psolve;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* store function pointers for user-supplied routines in KINLS interface */
  kinls_mem->pset   = psetup;
  kinls_mem->psolve = psolve;

  /* issue error if LS object does not support user-supplied preconditioning */
  if (kinls_mem->LS->ops->setpreconditioner == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "preconditioning");
    return (KINLS_ILL_INPUT);
  }

  /* notify iterative linear solver to call KINLs interface routines */
  kinls_psetup = (psetup == NULL) ? NULL : kinLsPSetup;
  kinls_psolve = (psolve == NULL) ? NULL : kinLsPSolve;
  retval = SUNLinSolSetPreconditioner(kinls_mem->LS, kin_mem, kinls_psetup,
                                      kinls_psolve);
  if (retval != SUN_SUCCESS)
  {
    KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetPreconditioner");
    return (KINLS_SUNLS_FAIL);
  }

  return (KINLS_SUCCESS);
}